

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

bool __thiscall ValueSerializer::operator()(ValueSerializer *this,FILE *fp,string *value)

{
  size_t sVar1;
  bool bVar2;
  int size;
  int local_14;
  
  local_14 = (int)value->_M_string_length;
  sVar1 = fwrite(&local_14,4,1,(FILE *)fp);
  if (sVar1 == 1) {
    sVar1 = fwrite((value->_M_dataplus)._M_p,(long)local_14,1,(FILE *)fp);
    bVar2 = sVar1 == 1;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator()(FILE* fp, const string& value) {
    const int size = value.size();
    return (*this)(fp, size) && fwrite(value.c_str(), size, 1, fp) == 1;
  }